

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::Mutex::Await(Mutex *this,Condition *cond)

{
  bool bVar1;
  
  if (cond->eval_ != (_func_bool_Condition_ptr *)0x0) {
    bVar1 = (*cond->eval_)(cond);
    if (!bVar1) {
      bVar1 = AwaitCommon(this,cond,(KernelTimeout)0x0);
      if (bVar1) {
        return;
      }
      raw_logging_internal::RawLog
                (kFatal,"mutex.cc",0x613,"Check %s failed: %s",
                 "this->AwaitCommon(cond, KernelTimeout::Never())",
                 "condition untrue on return from Await");
      return;
    }
  }
  AssertReaderHeld(this);
  return;
}

Assistant:

void Mutex::Await(const Condition &cond) {
  if (cond.Eval()) {    // condition already true; nothing to do
    if (kDebugMode) {
      this->AssertReaderHeld();
    }
  } else {              // normal case
    ABSL_RAW_CHECK(this->AwaitCommon(cond, KernelTimeout::Never()),
                   "condition untrue on return from Await");
  }
}